

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall kratos::FSM::realize(FSM *this)

{
  pointer *pppFVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args;
  ushort uVar3;
  VarType VVar4;
  size_t sVar5;
  long lVar6;
  Generator *pGVar7;
  FSM *name;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar8;
  FSM *pFVar9;
  key_type pFVar10;
  key_type pFVar11;
  element_type *this_00;
  pointer ppFVar12;
  byte bVar13;
  long lVar14;
  long *plVar15;
  pointer pcVar16;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar17;
  mapped_type *pmVar18;
  EnumVar *current_state;
  EnumVar *next_state;
  UserException *pUVar19;
  uint32_t width;
  FSM **fsm;
  size_type *psVar20;
  _Alloc_hider _Var21;
  byte bVar22;
  undefined8 *puVar23;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar24;
  _Hash_node_base *p_Var25;
  undefined1 auVar26 [8];
  double dVar27;
  undefined1 auVar28 [16];
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_208 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  raw_def;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  undefined1 local_1c8 [24];
  pointer ppStack_1b0;
  undefined1 local_1a8 [8];
  unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  state_name_mapping;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  undefined1 local_150 [8];
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  shared_ptr<kratos::Var> predicate;
  undefined1 local_110 [16];
  undefined1 local_100 [8];
  string next_state_name;
  IfStmt *local_c8;
  shared_ptr<kratos::IfStmt> seq_if;
  string current_state_name;
  undefined1 auStack_88 [8];
  undefined1 local_80 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  undefined4 uStack_58;
  uint uStack_54;
  vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> fsms;
  
  if (this->realized_ != false) {
    return;
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_150,this,false
            );
  lVar14 = (long)states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                 _M_impl.super__Vector_impl_data._M_start - (long)local_150;
  if (lVar14 == 0) {
    pUVar19 = (UserException *)__cxa_allocate_exception(0x10);
    seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->fsm_name_)._M_dataplus._M_p;
    current_state_name._M_dataplus._M_p = (pointer)(this->fsm_name_)._M_string_length;
    format_str_00.size_ = 0xd;
    format_str_00.data_ = (char *)0x10;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)
             &seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_1a8,(detail *)"FSM {0} is empty",format_str_00,args_00);
    UserException::UserException(pUVar19,(string *)local_1a8);
    __cxa_throw(pUVar19,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  auVar28._8_4_ = (int)(lVar14 >> 0x23);
  auVar28._0_8_ = lVar14 >> 3;
  auVar28._12_4_ = 0x45300000;
  dVar27 = log2((auVar28._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)(lVar14 >> 3)) - 4503599627370496.0));
  dVar27 = ceil(dVar27);
  auVar26 = local_150;
  width = 1;
  if (1 < (uint)(long)dVar27) {
    width = (uint)(long)dVar27;
  }
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&raw_def;
  raw_def._M_t._M_impl._0_4_ = 0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    pUVar19 = (UserException *)__cxa_allocate_exception(0x10);
    seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->fsm_name_)._M_dataplus._M_p;
    current_state_name._M_dataplus._M_p = (pointer)(this->fsm_name_)._M_string_length;
    format_str_01.size_ = 0xd;
    format_str_01.data_ = (char *)0x22;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)
             &seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_1a8,(detail *)"FSM {0} doesn\'t have a start state",format_str_01,
               args_01);
    UserException::UserException(pUVar19,(string *)local_1a8);
    __cxa_throw(pUVar19,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1a8 = (undefined1  [8])&state_name_mapping._M_h._M_rehash_policy._M_next_resize;
  state_name_mapping._M_h._M_buckets = (__buckets_ptr)0x1;
  state_name_mapping._M_h._M_bucket_count = 0;
  state_name_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  state_name_mapping._M_h._M_element_count._0_4_ = 0x3f800000;
  state_name_mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  state_name_mapping._M_h._M_rehash_policy._4_4_ = 0;
  state_name_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (local_150 !=
      (undefined1  [8])
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar5 = (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    lVar14 = 0;
    __args = &seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var25 = (_Hash_node_base *)0x0;
    do {
      seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&current_state_name._M_string_length;
      current_state_name._M_dataplus._M_p = (pointer)0x0;
      current_state_name._M_string_length = current_state_name._M_string_length & 0xffffffffffffff00
      ;
      if (sVar5 == 0) {
        std::__cxx11::string::_M_assign((string *)__args);
      }
      else {
        _uStack_58 = (char *)&fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
        lVar6 = **(long **)(*(long *)((long)auVar26 + (long)p_Var25 * 8) + 0x30);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffffffa8,lVar6,
                   (*(long **)(*(long *)((long)auVar26 + (long)p_Var25 * 8) + 0x30))[1] + lVar6);
        std::__cxx11::string::append((char *)&stack0xffffffffffffffa8);
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&stack0xffffffffffffffa8,
                                     *(ulong *)(*(long *)((long)auVar26 + (long)p_Var25 * 8) + 0x10)
                                    );
        psVar20 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar20) {
          next_state_name._M_string_length = *psVar20;
          next_state_name.field_2._M_allocated_capacity = plVar15[3];
          local_100 = (undefined1  [8])&next_state_name._M_string_length;
        }
        else {
          next_state_name._M_string_length = *psVar20;
          local_100 = (undefined1  [8])*plVar15;
        }
        next_state_name._M_dataplus._M_p = (pointer)plVar15[1];
        *plVar15 = (long)psVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::operator=((string *)__args,(string *)local_100);
        if (local_100 != (undefined1  [8])&next_state_name._M_string_length) {
          operator_delete((void *)local_100,next_state_name._M_string_length + 1);
        }
        if ((pointer *)_uStack_58 !=
            &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(_uStack_58,
                          (long)fsms.
                                super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1);
        }
      }
      local_100 = (undefined1  [8])p_Var25;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_emplace_unique<std::__cxx11::string&,unsigned_long>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                 (unsigned_long *)local_100);
      std::
      _Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::__cxx11::string>,std::allocator<std::pair<kratos::FSMState*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::FSMState*const&,std::__cxx11::string&>
                ((_Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::__cxx11::string>,std::allocator<std::pair<kratos::FSMState*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_1a8,(pointer)((long)auVar26 + lVar14),__args);
      FSMState::check_outputs(*(FSMState **)((long)auVar26 + (long)p_Var25 * 8));
      if (seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&current_state_name._M_string_length) {
        operator_delete(seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,current_state_name._M_string_length + 1);
      }
      pcVar16 = (pointer)((long)auVar26 + lVar14);
      lVar14 = lVar14 + 8;
      p_Var25 = (_Hash_node_base *)((long)&p_Var25->_M_nxt + 1);
    } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pcVar16 + 8) !=
             stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  }
  pGVar7 = this->generator_;
  pcVar16 = (this->fsm_name_)._M_dataplus._M_p;
  seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&current_state_name._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pcVar16,pcVar16 + (this->fsm_name_)._M_string_length);
  std::__cxx11::string::append
            ((char *)&seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       Generator::enum_(pGVar7,(string *)
                               &seq_if.
                                super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)local_208,width);
  if (seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&current_state_name._M_string_length) {
    operator_delete(seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,current_state_name._M_string_length + 1);
  }
  if (this->generator_->debug == true) {
    seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_88;
    current_state_name._M_dataplus._M_p = (pointer)0x1;
    current_state_name._M_string_length = 0;
    current_state_name.field_2._M_allocated_capacity = 0;
    current_state_name.field_2._8_4_ = 0x3f800000;
    auStack_88 = (undefined1  [8])0x0;
    if (local_150 !=
        (undefined1  [8])
        states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pppFVar1 = &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      auVar26 = local_150;
      do {
        name = (*(key_type *)auVar26)->parent_;
        aVar24 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                  )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                     *)(&(seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base +
                       (ulong)name % (ulong)current_state_name._M_dataplus._M_p))->values_;
        aVar17.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0;
        if ((aVar24.values_ !=
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0) && (aVar8.values_ =
                           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                            *)((aVar24.values_)->field_0).named_args.data, aVar17 = aVar24,
                     name != (FSM *)((aVar8.values_)->field_0).string.size)) {
          while (in_R9 = aVar8,
                aVar8.values_ =
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)((in_R9.values_)->field_0).named_args.data,
                (named_arg_info<char> *)aVar8.values_ != (named_arg_info<char> *)0x0) {
            pFVar9 = (FSM *)((aVar8.values_)->field_0).string.size;
            aVar17.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0;
            if (((ulong)pFVar9 % (ulong)current_state_name._M_dataplus._M_p !=
                 (ulong)name % (ulong)current_state_name._M_dataplus._M_p) ||
               (aVar17 = in_R9, name == pFVar9)) goto LAB_001fc716;
          }
          aVar17.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0;
        }
LAB_001fc716:
        if ((aVar17.values_ ==
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0) || (((aVar17.values_)->field_0).long_long_value == 0)) {
          local_100 = (undefined1  [8])0x0;
          next_state_name._M_dataplus._M_p = (pointer)(name->fn_name_ln_)._M_h._M_bucket_count;
          next_state_name._M_string_length = 0;
          next_state_name.field_2._M_allocated_capacity = (name->fn_name_ln_)._M_h._M_element_count;
          next_state_name.field_2._8_8_ = *(undefined8 *)&(name->fn_name_ln_)._M_h._M_rehash_policy;
          _uStack_58 = (char *)local_100;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_100,&(name->fn_name_ln_)._M_h,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_true>_>_>
                      *)&stack0xffffffffffffffa8);
          for (puVar23 = (undefined8 *)next_state_name._M_string_length;
              puVar23 != (undefined8 *)0x0; puVar23 = (undefined8 *)*puVar23) {
            get_state((FSM *)&stack0xffffffffffffffa8,&name->fsm_name_);
            _Var21._M_p = _uStack_58;
            if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                         _M_impl.super__Vector_impl_data._M_start);
            }
            pFVar10 = *(key_type *)auVar26;
            aVar24 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                      )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                         *)((long)local_1a8 +
                           ((ulong)pFVar10 % (ulong)state_name_mapping._M_h._M_buckets) * 8))->
                       values_;
            aVar17.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0;
            if ((aVar24.values_ !=
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0) &&
               (in_R9.values_ =
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)((aVar24.values_)->field_0).named_args.data, aVar17 = aVar24,
               aVar24.values_ = in_R9.values_,
               pFVar10 != (key_type)((in_R9.values_)->field_0).string.size)) {
              while (in_R9.values_ =
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)((aVar24.values_)->field_0).named_args.data,
                    (named_arg_info<char> *)in_R9.values_ != (named_arg_info<char> *)0x0) {
                pFVar11 = (key_type)((in_R9.values_)->field_0).string.size;
                aVar17.values_ =
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)0x0;
                if (((ulong)pFVar11 % (ulong)state_name_mapping._M_h._M_buckets !=
                     (ulong)pFVar10 % (ulong)state_name_mapping._M_h._M_buckets) ||
                   (aVar17 = aVar24, aVar24.values_ = in_R9.values_, pFVar10 == pFVar11))
                goto LAB_001fc81d;
              }
              aVar17.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0;
            }
LAB_001fc81d:
            if ((aVar17.values_ ==
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0) || (((aVar17.values_)->field_0).long_long_value == 0)) {
              pUVar19 = (UserException *)__cxa_allocate_exception(0x10);
              _uStack_58 = *(char **)(_Var21._M_p + 0x10);
              fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
              super__Vector_impl_data._M_start = *(pointer *)(_Var21._M_p + 0x18);
              fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)(this->fsm_name_)._M_dataplus._M_p;
              fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)(this->fsm_name_)._M_string_length;
              format_str.size_ = 0xdd;
              format_str.data_ = (char *)0x47;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)&state_name_mapping._M_h._M_single_bucket,
                         (detail *)
                         "Unable to find state name {0} from FSM {1}. Is it a disconnected state?",
                         format_str,args);
              UserException::UserException
                        (pUVar19,(string *)&state_name_mapping._M_h._M_single_bucket);
              __cxa_throw(pUVar19,&UserException::typeinfo,std::runtime_error::~runtime_error);
            }
            pmVar18 = std::__detail::
                      _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)local_1a8,(key_type *)auVar26);
            pcVar16 = (pmVar18->_M_dataplus)._M_p;
            _uStack_58 = (char *)pppFVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&stack0xffffffffffffffa8,pcVar16,
                       pcVar16 + pmVar18->_M_string_length);
            Enum::add_debug_info
                      ((Enum *)stmt.
                               super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,(string *)&stack0xffffffffffffffa8,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                        *)(puVar23 + 5));
            if ((pointer *)_uStack_58 != pppFVar1) {
              operator_delete(_uStack_58,
                              (long)fsms.
                                    super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 1);
            }
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_100);
        }
        auVar26 = (undefined1  [8])((long)auVar26 + 8);
      } while (auVar26 !=
               (undefined1  [8])
               states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
               _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  }
  pGVar7 = this->generator_;
  local_100 = (undefined1  [8])&next_state_name._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"current_state","");
  Generator::get_unique_variable_name
            ((string *)
             &seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pGVar7,&this->fsm_name_,(string *)local_100);
  if (local_100 != (undefined1  [8])&next_state_name._M_string_length) {
    operator_delete((void *)local_100,next_state_name._M_string_length + 1);
  }
  pGVar7 = this->generator_;
  pppFVar1 = &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  _uStack_58 = (char *)pppFVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffa8,"next_state","");
  Generator::get_unique_variable_name
            ((string *)local_100,pGVar7,&this->fsm_name_,(string *)&stack0xffffffffffffffa8);
  if ((pointer *)_uStack_58 != pppFVar1) {
    operator_delete(_uStack_58,
                    (long)fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish + 1);
  }
  pGVar7 = this->generator_;
  std::__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Enum,void>
            ((__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
             (__weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2> *)
             stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  current_state =
       Generator::enum_var(pGVar7,(string *)
                                  &seq_if.
                                   super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount,(shared_ptr<kratos::Enum> *)&stack0xffffffffffffffa8)
  ;
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  this->current_state_ = current_state;
  pGVar7 = this->generator_;
  std::__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Enum,void>
            ((__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
             (__weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2> *)
             stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  next_state = Generator::enum_var(pGVar7,(string *)local_100,
                                   (shared_ptr<kratos::Enum> *)&stack0xffffffffffffffa8);
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (this->generator_->debug == true) {
    _uStack_58 = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x95);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(current_state->super_Var).super_IRNode.fn_name_ln,
               (pair<const_char_*,_int> *)&stack0xffffffffffffffa8);
    _uStack_58 = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x96);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(next_state->super_Var).super_IRNode.fn_name_ln,
               (pair<const_char_*,_int> *)&stack0xffffffffffffffa8);
  }
  Generator::sequential((Generator *)&state_name_mapping._M_h._M_single_bucket);
  _uStack_58 = (char *)((ulong)_uStack_58 & 0xffffffff00000000);
  fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
           super__Vector_impl_data._M_finish)->_M_use_count + 1;
    }
  }
  SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)state_name_mapping._M_h._M_single_bucket,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)&stack0xffffffffffffffa8)
  ;
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  VVar4 = ((this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_
  ;
  if (VVar4 == PortIO) {
    Var::as<kratos::Port>((Var *)local_1c8);
    uVar3 = *(ushort *)(local_1c8._0_8_ + 0x278);
    if ((uVar3 & 0x100) != 0) {
      Var::as<kratos::Port>((Var *)&raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar22 = 1;
      bVar13 = 1;
      if ((*(byte *)(raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x278) & 1) == 0)
      goto LAB_001fcaed;
    }
    bVar22 = this->reset_high_ ^ 1;
    bVar13 = (byte)(uVar3 >> 8) & 1;
  }
  else {
    bVar13 = 0;
    bVar22 = 0;
  }
LAB_001fcaed:
  if ((bVar13 != 0) && (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
  }
  if ((VVar4 == PortIO) && ((pointer)local_1c8._8_8_ != (pointer)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  if (bVar22 == 0) {
    _uStack_58 = (char *)((ulong)uStack_54 << 0x20);
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    SequentialStmtBlock::add_condition
              ((SequentialStmtBlock *)state_name_mapping._M_h._M_single_bucket,
               (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
               &stack0xffffffffffffffa8);
  }
  else {
    uStack_58 = 1;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    SequentialStmtBlock::add_condition
              ((SequentialStmtBlock *)state_name_mapping._M_h._M_single_bucket,
               (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
               &stack0xffffffffffffffa8);
  }
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (this->generator_->debug == true) {
    _uStack_58 = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0xab);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)(state_name_mapping._M_h._M_single_bucket + 1),
               (pair<const_char_*,_int> *)&stack0xffffffffffffffa8);
  }
  states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  if (bVar22 == 0) {
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&predicate,
               &(this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    Var::r_not((this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Var::as<kratos::Var>((Var *)&stack0xffffffffffffffa8);
    ppFVar12 = fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)_uStack_58;
    this_00 = predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _uStack_58 = (char *)0x0;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppFVar12;
    if (this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  local_c8 = (IfStmt *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,std::shared_ptr<kratos::Var>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&seq_if,&local_c8,
             (allocator<kratos::IfStmt> *)&stack0xffffffffffffffa8,
             (shared_ptr<kratos::Var> *)
             &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)&local_c8,local_c8);
  local_80 = (undefined1  [8])
             (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  pmVar18 = std::__detail::
            _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)local_1a8,(key_type *)local_80);
  _uStack_58 = (char *)&fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
  pcVar16 = (pmVar18->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffa8,pcVar16,pcVar16 + pmVar18->_M_string_length);
  Enum::get_enum((Enum *)(local_1c8 + 0x10),
                 (string *)
                 stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
  local_110._0_8_ = local_1c8._16_8_;
  local_110._8_8_ = ppStack_1b0;
  local_1c8._16_8_ = (pointer)0x0;
  ppStack_1b0 = (pointer)0x0;
  Var::assign((Var *)local_80,(shared_ptr<kratos::Var> *)current_state,(AssignmentType)local_110);
  if ((pointer)local_110._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
  }
  if (ppStack_1b0 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_1b0);
  }
  local_110._0_8_ = local_80;
  local_110._8_8_ = stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  IfStmt::add_then_stmt(local_c8,(shared_ptr<kratos::Stmt> *)local_110);
  if ((element_type *)local_110._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
  }
  if (this->generator_->debug == true) {
    if ((this->start_state_debug_).first._M_string_length != 0) {
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)&(((enable_shared_from_this<kratos::FSMState> *)local_80)->_M_weak_this).
                     super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &this->start_state_debug_);
    }
    local_110._0_8_ = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
    local_110._8_4_ = 0xbf;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(((enable_shared_from_this<kratos::FSMState> *)local_80)->_M_weak_this).
                   super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (pair<const_char_*,_int> *)local_110);
  }
  if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((pointer *)_uStack_58 !=
      &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete(_uStack_58,
                    (long)fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish + 1);
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_80,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(next_state->super_Var).super_enable_shared_from_this<kratos::Var>);
  Var::assign((Var *)&stack0xffffffffffffffa8,(shared_ptr<kratos::Var> *)current_state,
              (AssignmentType)local_80);
  if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (this->generator_->debug == true) {
    local_80 = (undefined1  [8])0x268457;
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _4_4_,0xc5);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)(_uStack_58 + 8),(pair<const_char_*,_int> *)local_80);
  }
  local_80 = (undefined1  [8])_uStack_58;
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start + 1) =
           *(int *)(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                    super__Vector_impl_data._M_start + 1) + 1;
      UNLOCK();
    }
    else {
      *(int *)(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start + 1) =
           *(int *)(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                    super__Vector_impl_data._M_start + 1) + 1;
    }
  }
  IfStmt::add_else_stmt(local_c8,(shared_ptr<kratos::Stmt> *)local_80);
  if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  _uStack_58 = (char *)local_c8;
  fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  StmtBlock::add_stmt((StmtBlock *)state_name_mapping._M_h._M_single_bucket,
                      (shared_ptr<kratos::Stmt> *)&stack0xffffffffffffffa8);
  if (fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (this->generator_->debug == true) {
    _uStack_58 = "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/fsm.cc";
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0xca);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(local_c8->super_Stmt).super_IRNode.fn_name_ln,
               (pair<const_char_*,_int> *)&stack0xffffffffffffffa8);
  }
  generate_state_transition
            (this,(Enum *)stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,current_state,next_state,
             (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1a8);
  if (this->moore_ == true) {
    generate_output(this,(Enum *)stmt.
                                 super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,current_state,
                    (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
  }
  get_all_child_fsm((vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)
                    &stack0xffffffffffffffa8,this);
  for (_Var21._M_p = _uStack_58;
      (pointer)_Var21._M_p !=
      fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
      super__Vector_impl_data._M_start;
      _Var21._M_p = (pointer)&(((IfStmt *)_Var21._M_p)->super_Stmt).super_IRNode.fn_name_ln) {
    *(undefined1 *)((((IfStmt *)_Var21._M_p)->super_Stmt).super_IRNode._vptr_IRNode + 0x28) = 1;
  }
  this->realized_ = true;
  if ((IfStmt *)_uStack_58 != (IfStmt *)0x0) {
    operator_delete(_uStack_58,
                    (long)fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)_uStack_58);
  }
  if (seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (local_100 != (undefined1  [8])&next_state_name._M_string_length) {
    operator_delete((void *)local_100,next_state_name._M_string_length + 1);
  }
  if (seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&current_state_name._M_string_length) {
    operator_delete(seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,current_state_name._M_string_length + 1);
  }
  std::
  _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)local_208);
  if (local_150 != (undefined1  [8])0x0) {
    operator_delete((void *)local_150,
                    (long)states.
                          super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_150);
  }
  return;
}

Assistant:

void FSM::realize() {
    // never realize again
    if (realized_) return;
    // generate the statements to the generator
    // first, get state and next state variable
    // compute number of states
    auto states = get_all_child_states(false);
    uint64_t num_states = states.size();
    if (!num_states) throw UserException(::format("FSM {0} is empty", fsm_name()));
    uint32_t width = std::max<uint32_t>(1u, std::ceil(std::log2(num_states)));
    // define a enum type
    std::map<std::string, uint64_t> raw_def;
    uint64_t count = 0;
    if (!start_state_)
        throw UserException(::format("FSM {0} doesn't have a start state", fsm_name_));
    // name mapping
    std::unordered_map<FSMState*, std::string> state_name_mapping;
    bool has_child_state = !child_fsms_.empty();
    for (auto const& state : states) {
        // notice that we need to do an additional mapping if it's a nested fsm
        // to avoid any name conflicts
        std::string state_name;
        if (has_child_state) {
            state_name = state->parent()->fsm_name() + "_" + state->name();
        } else {
            state_name = state->name();
        }
        raw_def.emplace(state_name, count++);
        state_name_mapping.emplace(state, state_name);
        // check states
        state->check_outputs();
    }
    auto& enum_def = generator_->enum_(fsm_name_ + "_state", raw_def, width);
    // add debug info
    if (generator_->debug) {
        std::unordered_set<const FSM*> visited;
        for (auto const& state : states) {
            const auto* fsm = state->parent();
            if (visited.find(fsm) != visited.end()) continue;
            auto fn_ln = fsm->fn_name_ln_;
            for (auto const& [name, info] : fn_ln) {
                auto* s = fsm->get_state(name).get();
                if (state_name_mapping.find(state) == state_name_mapping.end()) {
                    throw UserException(::format(
                        "Unable to find state name {0} from FSM {1}. Is it a disconnected state?",
                        s->name(), fsm_name_));
                }
                auto state_name = state_name_mapping.at(state);
                enum_def.add_debug_info(state_name, info);
            }
        }
    }
    // create two state variable, current_state, and next_state
    auto current_state_name = generator_->get_unique_variable_name(fsm_name_, "current_state");
    auto next_state_name = generator_->get_unique_variable_name(fsm_name_, "next_state");
    auto& current_state = generator_->enum_var(current_state_name, enum_def.shared_from_this());
    current_state_ = &current_state;
    auto& next_state = generator_->enum_var(next_state_name, enum_def.shared_from_this());
    if (generator_->debug) {
        current_state.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        next_state.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }

    // sequential logic
    // if (reset)
    //   current_state <= default_state
    // else
    //   current_state <= next_state
    auto seq = generator_->sequential();
    bool reset_high = true;
    seq->add_condition({EventEdgeType::Posedge, clk_});
    if (reset_->type() == VarType::PortIO &&
        ((reset_->as<Port>()->active_high() && !(*reset_->as<Port>()->active_high())) ||
         !reset_high_)) {
        seq->add_condition({EventEdgeType::Negedge, reset_});
        reset_high = false;
    } else {
        seq->add_condition({EventEdgeType::Posedge, reset_});
        reset_high = true;
    }
    if (generator_->debug) {
        seq->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }

    std::shared_ptr<Var> predicate;
    if (reset_high) {
        predicate = reset_;
    } else {
        predicate = (reset_->r_not()).as<Var>();
    }

    auto seq_if = std::make_shared<IfStmt>(predicate);
    {
        auto start_state_name = state_name_mapping.at(start_state_.get());
        auto stmt =
            current_state.assign(enum_def.get_enum(start_state_name), AssignmentType::NonBlocking);
        seq_if->add_then_stmt(stmt);
        if (generator_->debug) {
            if (!start_state_debug_.first.empty()) {
                stmt->fn_name_ln.emplace_back(start_state_debug_);
            }
            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
    }
    {
        auto stmt =
            current_state.assign(next_state.shared_from_this(), AssignmentType::NonBlocking);
        if (generator_->debug) stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        seq_if->add_else_stmt(stmt);
    }
    // add it to the seq
    seq->add_stmt(seq_if);
    if (generator_->debug) seq_if->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));

    // combination logic to compute next state
    generate_state_transition(enum_def, current_state, next_state, state_name_mapping);

    // now the output logic
    // only generate output state block in moore machine. in mealy machine, the output
    // is fused inside the state transition.
    if (moore_) generate_output(enum_def, current_state, state_name_mapping);

    // set to realized for all states
    auto fsms = get_all_child_fsm();
    for (auto& fsm : fsms) fsm->realized_ = true;
    realized_ = true;
}